

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoprism.h
# Opt level: O1

void pzgeom::TPZGeoPrism::X<double>(TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  int j;
  long lVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  TPZFNMatrix<6,_double> phi;
  TPZFNMatrix<18,_double> dphi;
  TPZFMatrix<double> local_220;
  double local_190 [7];
  TPZFMatrix<double> local_158;
  double adStack_c8 [19];
  
  local_220.fElem = local_190;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 6;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018ab3b0;
  local_220.fSize = 6;
  local_220.fGiven = local_220.fElem;
  TPZVec<int>::TPZVec(&local_220.fPivot.super_TPZVec<int>,0);
  local_220.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_220.fPivot.super_TPZVec<int>.fStore = local_220.fPivot.fExtAlloc;
  local_220.fPivot.super_TPZVec<int>.fNElements = 0;
  local_220.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_220.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_220.fWork.fStore = (double *)0x0;
  local_220.fWork.fNElements = 0;
  local_220.fWork.fNAlloc = 0;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ab0c0;
  local_158.fElem = adStack_c8;
  local_158.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_158.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 6;
  local_158.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_158.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_158.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018add20;
  local_158.fSize = 0x12;
  local_158.fGiven = local_158.fElem;
  TPZVec<int>::TPZVec(&local_158.fPivot.super_TPZVec<int>,0);
  local_158.fPivot.super_TPZVec<int>.fStore = local_158.fPivot.fExtAlloc;
  local_158.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_158.fPivot.super_TPZVec<int>.fNElements = 0;
  local_158.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_158.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_158.fWork.fStore = (double *)0x0;
  local_158.fWork.fNElements = 0;
  local_158.fWork.fNAlloc = 0;
  local_158.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ada30;
  pztopology::TPZPrism::TShape<double>(loc,&local_220,&local_158);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      x->fStore[uVar4] = 0.0;
      lVar3 = 0;
      do {
        if ((local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_220.fElem[lVar3];
        (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(nodes,uVar4,lVar3);
        x->fStore[uVar4] = dVar1 * extraout_XMM0_Qa + x->fStore[uVar4];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar2 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_158,&PTR_PTR_018adce8);
  TPZFMatrix<double>::~TPZFMatrix(&local_220,&PTR_PTR_018ab378);
  return;
}

Assistant:

inline void TPZGeoPrism::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<6,T> phi(6,1);
        TPZFNMatrix<18,T> dphi(3,6);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 6; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }